

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O1

ssize_t uv_wtf8_length_as_utf16(char *source_ptr)

{
  char cVar1;
  int32_t iVar2;
  long lVar3;
  char *in_RDI;
  char *local_18;
  
  lVar3 = 0;
  local_18 = in_RDI;
  do {
    iVar2 = uv__wtf8_decode1(&local_18);
    if (iVar2 < 0) {
      return -1;
    }
    lVar3 = lVar3 + (ulong)(0xffff < iVar2) + 1;
    cVar1 = *local_18;
    local_18 = local_18 + 1;
  } while (cVar1 != '\0');
  return lVar3;
}

Assistant:

ssize_t uv_wtf8_length_as_utf16(const char* source_ptr) {
  size_t w_target_len = 0;
  int32_t code_point;

  do {
    code_point = uv__wtf8_decode1(&source_ptr);
    if (code_point < 0)
      return -1;
    if (code_point > 0xFFFF)
      w_target_len++;
    w_target_len++;
  } while (*source_ptr++);

  return w_target_len;
}